

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,short element)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  Align(this,2);
  uStack_18 = CONCAT26(element,(undefined6)uStack_18);
  vector_downward<unsigned_int>::push_small<short>(&this->buf_,(short *)((long)&uStack_18 + 6));
  return (this->buf_).size_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }